

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O2

iterator __thiscall
Corrade::Utility::ConfigurationGroup::findGroup(ConfigurationGroup *this,string *name,uint index)

{
  Group *pGVar1;
  __type _Var2;
  uint uVar3;
  Group *__lhs;
  
  __lhs = (this->_groups).
          super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
          ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  do {
    pGVar1 = (this->_groups).
             super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__lhs == pGVar1) {
      return (iterator)pGVar1;
    }
    _Var2 = std::operator==(&__lhs->name,name);
    if (_Var2) {
      if (uVar3 == index) {
        return (iterator)__lhs;
      }
      uVar3 = uVar3 + 1;
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

auto ConfigurationGroup::findGroup(const std::string& name, const unsigned int index) -> std::vector<Group>::iterator {
    unsigned int foundIndex = 0;
    for(auto it = _groups.begin(); it != _groups.end(); ++it)
        if(it->name == name && foundIndex++ == index) return it;

    return _groups.end();
}